

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests2.cpp
# Opt level: O3

void __thiscall
test::prod_test::iu_ProdTest_x_iutest_x_PeepA2_Test::Body(iu_ProdTest_x_iutest_x_PeepA2_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *in_R9;
  AssertionResult iutest_ar;
  allocator<char> local_1f9;
  AssertionResult local_1f8;
  AssertionHelper local_1d0;
  undefined1 local_1a0 [392];
  
  *(undefined4 *)
   ((long)&DAT_003b4387 +
   iutest::detail::peep_tag<test::prod_test::iu_peep_tag_m_a<test::prod_test::ProdClass>>::value + 1
   ) = 2;
  local_1a0._0_4_ = 2;
  local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = DAT_003b4394;
  iutest::internal::CmpHelperEQ<int,int>
            (&local_1f8,(internal *)0x33044b,"s_prod_2.GetA()",local_1a0,(int *)&local_1d0,in_R9);
  if (local_1f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
    local_1d0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests2.cpp"
    ;
    local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x1f;
    local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
        &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._0_4_),
                      local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  }
  paVar1 = &local_1f8.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  local_1a0._0_4_ = 2;
  iutest::internal::CmpHelperEQ<int,int>
            (&local_1f8,(internal *)0x33044b,
             "(s_prod_2.*::iutest::detail::peep_tag< iu_peep_tag_m_a<ProdClass> >::value)",local_1a0
             ,(int *)((long)&DAT_003b4387 +
                     iutest::detail::
                     peep_tag<test::prod_test::iu_peep_tag_m_a<test::prod_test::ProdClass>>::value +
                     1),in_R9);
  if (local_1f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
    local_1d0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests2.cpp"
    ;
    local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x21;
    local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
        &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._0_4_),
                      local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(ProdTest, PeepA2)
{
    IUTEST_PEEP_GET(s_prod_2, ProdClass, m_a) = 2;
    IUTEST_EXPECT_EQ(2, s_prod_2.GetA());

    IUTEST_EXPECT_EQ(2, IUTEST_PEEP_GET(s_prod_2, ProdClass, m_a));
}